

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O3

size_type __thiscall
google::protobuf::stringpiece_internal::StringPiece::rfind
          (StringPiece *this,StringPiece s,size_type pos)

{
  ulong uVar1;
  char *pcVar2;
  size_type sVar3;
  ulong uVar4;
  char *pcVar5;
  
  uVar4 = s.length_;
  uVar1 = this->length_;
  sVar3 = 0xffffffffffffffff;
  if (uVar4 <= uVar1) {
    if (uVar4 == 0) {
      sVar3 = pos;
      if (uVar1 < pos) {
        sVar3 = uVar1;
      }
    }
    else {
      if (uVar1 - uVar4 < pos) {
        pos = uVar1 - uVar4;
      }
      pcVar5 = this->ptr_ + uVar4 + pos;
      pcVar2 = std::__find_end<char_const*,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                         (this->ptr_,pcVar5,s.ptr_,s.ptr_ + uVar4);
      sVar3 = 0xffffffffffffffff;
      if (pcVar2 != pcVar5) {
        sVar3 = (long)pcVar2 - (long)this->ptr_;
      }
    }
  }
  return sVar3;
}

Assistant:

StringPiece::size_type StringPiece::rfind(StringPiece s, size_type pos) const {
  if (length_ < s.length_) return npos;
  const size_t ulen = length_;
  if (s.length_ == 0) return std::min(ulen, pos);

  const char* last = ptr_ + std::min(ulen - s.length_, pos) + s.length_;
  const char* result = std::find_end(ptr_, last, s.ptr_, s.ptr_ + s.length_);
  return result != last ? result - ptr_ : npos;
}